

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glad_vulkan.c
# Opt level: O0

int gladLoadVulkanUserPtr(VkPhysicalDevice physical_device,GLADuserptrloadfunc load,void *userptr)

{
  int iVar1;
  int version;
  void *userptr_local;
  GLADuserptrloadfunc load_local;
  VkPhysicalDevice physical_device_local;
  
  glad_vkEnumerateInstanceVersion =
       (PFN_vkEnumerateInstanceVersion)(*load)("vkEnumerateInstanceVersion",userptr);
  physical_device_local._4_4_ = glad_vk_find_core_vulkan(physical_device);
  if (physical_device_local._4_4_ == 0) {
    physical_device_local._4_4_ = 0;
  }
  else {
    glad_vk_load_VK_VERSION_1_0(load,userptr);
    glad_vk_load_VK_VERSION_1_1(load,userptr);
    iVar1 = glad_vk_find_extensions_vulkan(physical_device);
    if (iVar1 == 0) {
      physical_device_local._4_4_ = 0;
    }
    else {
      glad_vk_load_VK_EXT_debug_report(load,userptr);
      glad_vk_load_VK_KHR_surface(load,userptr);
      glad_vk_load_VK_KHR_swapchain(load,userptr);
    }
  }
  return physical_device_local._4_4_;
}

Assistant:

int gladLoadVulkanUserPtr( VkPhysicalDevice physical_device, GLADuserptrloadfunc load, void *userptr) {
    int version;

#ifdef VK_VERSION_1_1
    vkEnumerateInstanceVersion  = (PFN_vkEnumerateInstanceVersion) load("vkEnumerateInstanceVersion", userptr);
#endif
    version = glad_vk_find_core_vulkan( physical_device);
    if (!version) {
        return 0;
    }

    glad_vk_load_VK_VERSION_1_0(load, userptr);
    glad_vk_load_VK_VERSION_1_1(load, userptr);

    if (!glad_vk_find_extensions_vulkan( physical_device)) return 0;
    glad_vk_load_VK_EXT_debug_report(load, userptr);
    glad_vk_load_VK_KHR_surface(load, userptr);
    glad_vk_load_VK_KHR_swapchain(load, userptr);


    return version;
}